

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplePacketizerReader.h
# Opt level: O2

void __thiscall
SimplePacketizerReader::setMPLSInfo
          (SimplePacketizerReader *this,
          vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo)

{
  pointer pMVar1;
  int iVar2;
  
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator=(&this->m_mplsInfo,mplsInfo);
  pMVar1 = (this->m_mplsInfo).super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pMVar1 == (this->m_mplsInfo).super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    iVar2 = -1;
  }
  else {
    this->m_lastMplsTime = (double)(pMVar1->OUT_time - pMVar1->IN_time) * 117600.0;
    iVar2 = 0;
  }
  this->m_curMplsIndex = iVar2;
  return;
}

Assistant:

void setMPLSInfo(const std::vector<MPLSPlayItem>& mplsInfo)
    {
        m_mplsInfo = mplsInfo;
        if (!m_mplsInfo.empty())
        {
            m_curMplsIndex = 0;
            m_lastMplsTime = (m_mplsInfo[0].OUT_time - m_mplsInfo[0].IN_time) * (INTERNAL_PTS_FREQ / 45000.0);
        }
        else
            m_curMplsIndex = -1;
    }